

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O3

int run_test_tcp_close_reset_client_after_shutdown(void)

{
  uv_loop_t *puVar1;
  int iVar2;
  int iVar3;
  undefined8 *extraout_RDX;
  uv_loop_t *unaff_RBX;
  uv_tcp_t *in_RSI;
  uv_tcp_t *puVar4;
  uv_tcp_t *handle;
  long *plVar5;
  int64_t eval_b;
  int64_t eval_a;
  long lStack_60;
  long lStack_58;
  uv_loop_t *puStack_50;
  undefined1 auStack_48 [16];
  undefined8 uStack_38;
  undefined1 auStack_30 [16];
  uv__queue *puStack_20;
  uv_loop_t *local_18;
  uv_loop_t *local_10;
  
  puVar4 = (uv_tcp_t *)&stack0xffffffffffffffe8;
  puStack_20 = (uv__queue *)0x1c92b8;
  loop = (uv_loop_t *)uv_default_loop();
  puStack_20 = (uv__queue *)0x1c92c7;
  start_server(loop,in_RSI);
  client_close = 1;
  shutdown_before_close = 1;
  puStack_20 = (uv__queue *)0x1c92e4;
  do_connect(loop,in_RSI);
  local_10 = (uv_loop_t *)(long)write_cb_called;
  local_18 = (uv_loop_t *)0x0;
  if (local_10 == (uv_loop_t *)0x0) {
    local_10 = (uv_loop_t *)(long)close_cb_called;
    local_18 = (uv_loop_t *)0x0;
    if (local_10 != (uv_loop_t *)0x0) goto LAB_001c9444;
    local_10 = (uv_loop_t *)(long)shutdown_cb_called;
    local_18 = (uv_loop_t *)0x0;
    if (local_10 != (uv_loop_t *)0x0) goto LAB_001c9451;
    puStack_20 = (uv__queue *)0x1c935b;
    iVar2 = uv_run(loop,0);
    puVar1 = loop;
    local_10 = (uv_loop_t *)(long)iVar2;
    local_18 = (uv_loop_t *)0x0;
    if (local_10 != (uv_loop_t *)0x0) goto LAB_001c945e;
    local_10 = (uv_loop_t *)0x4;
    local_18 = (uv_loop_t *)(long)write_cb_called;
    if (local_18 != (uv_loop_t *)0x4) goto LAB_001c946b;
    local_10 = (uv_loop_t *)(long)close_cb_called;
    local_18 = (uv_loop_t *)0x0;
    if (local_10 != (uv_loop_t *)0x0) goto LAB_001c9478;
    local_10 = (uv_loop_t *)0x1;
    local_18 = (uv_loop_t *)(long)shutdown_cb_called;
    if (local_18 != (uv_loop_t *)0x1) goto LAB_001c9485;
    puStack_20 = (uv__queue *)0x1c93fa;
    uv_walk(loop,close_walk_cb,0);
    puStack_20 = (uv__queue *)0x1c9404;
    uv_run(puVar1,0);
    local_10 = (uv_loop_t *)0x0;
    puStack_20 = (uv__queue *)0x1c9419;
    iVar2 = uv_loop_close(loop);
    local_18 = (uv_loop_t *)(long)iVar2;
    unaff_RBX = puVar1;
    if (local_10 == local_18) {
      puStack_20 = (uv__queue *)0x1c942f;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_20 = (uv__queue *)0x1c9444;
    run_test_tcp_close_reset_client_after_shutdown_cold_1();
LAB_001c9444:
    puStack_20 = (uv__queue *)0x1c9451;
    run_test_tcp_close_reset_client_after_shutdown_cold_2();
LAB_001c9451:
    puStack_20 = (uv__queue *)0x1c945e;
    run_test_tcp_close_reset_client_after_shutdown_cold_3();
LAB_001c945e:
    puStack_20 = (uv__queue *)0x1c946b;
    run_test_tcp_close_reset_client_after_shutdown_cold_4();
LAB_001c946b:
    puStack_20 = (uv__queue *)0x1c9478;
    run_test_tcp_close_reset_client_after_shutdown_cold_5();
LAB_001c9478:
    puStack_20 = (uv__queue *)0x1c9485;
    run_test_tcp_close_reset_client_after_shutdown_cold_6();
LAB_001c9485:
    puStack_20 = (uv__queue *)0x1c9492;
    run_test_tcp_close_reset_client_after_shutdown_cold_7();
  }
  puStack_20 = (uv__queue *)run_test_tcp_close_reset_accepted;
  run_test_tcp_close_reset_client_after_shutdown_cold_8();
  handle = (uv_tcp_t *)auStack_30;
  uStack_38._0_4_ = 0x1c94a9;
  uStack_38._4_4_ = 0;
  puStack_20 = (uv__queue *)unaff_RBX;
  loop = (uv_loop_t *)uv_default_loop();
  uStack_38._0_4_ = 0x1c94b8;
  uStack_38._4_4_ = 0;
  start_server(loop,puVar4);
  client_close = 0;
  shutdown_before_close = 0;
  uStack_38._0_4_ = 0x1c94d5;
  uStack_38._4_4_ = 0;
  do_connect(loop,puVar4);
  auStack_30._8_8_ = SEXT48(write_cb_called);
  auStack_30._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_30._8_8_ == (uv_loop_t *)0x0) {
    auStack_30._8_8_ = SEXT48(close_cb_called);
    auStack_30._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_30._8_8_ != (uv_loop_t *)0x0) goto LAB_001c9635;
    auStack_30._8_8_ = SEXT48(shutdown_cb_called);
    auStack_30._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_30._8_8_ != (uv_loop_t *)0x0) goto LAB_001c9642;
    uStack_38._0_4_ = 0x1c954c;
    uStack_38._4_4_ = 0;
    iVar2 = uv_run(loop,0);
    puVar1 = loop;
    auStack_30._8_8_ = SEXT48(iVar2);
    auStack_30._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_30._8_8_ != (uv_loop_t *)0x0) goto LAB_001c964f;
    auStack_30._8_8_ = (uv_loop_t *)0x4;
    auStack_30._0_8_ = SEXT48(write_cb_called);
    if ((uv_loop_t *)auStack_30._0_8_ != (uv_loop_t *)0x4) goto LAB_001c965c;
    auStack_30._8_8_ = (uv_loop_t *)0x1;
    auStack_30._0_8_ = SEXT48(close_cb_called);
    if ((uv_loop_t *)auStack_30._0_8_ != (uv_loop_t *)0x1) goto LAB_001c9669;
    auStack_30._8_8_ = SEXT48(shutdown_cb_called);
    auStack_30._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_30._8_8_ != (uv_loop_t *)0x0) goto LAB_001c9676;
    uStack_38._0_4_ = 0x1c95eb;
    uStack_38._4_4_ = 0;
    uv_walk(loop,close_walk_cb,0);
    uStack_38._0_4_ = 0x1c95f5;
    uStack_38._4_4_ = 0;
    uv_run(puVar1,0);
    auStack_30._8_8_ = (uv_loop_t *)0x0;
    uStack_38._0_4_ = 0x1c960a;
    uStack_38._4_4_ = 0;
    iVar2 = uv_loop_close(loop);
    auStack_30._0_8_ = SEXT48(iVar2);
    unaff_RBX = puVar1;
    if (auStack_30._8_8_ == auStack_30._0_8_) {
      uStack_38._0_4_ = 0x1c9620;
      uStack_38._4_4_ = 0;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    uStack_38._0_4_ = 0x1c9635;
    uStack_38._4_4_ = 0;
    run_test_tcp_close_reset_accepted_cold_1();
LAB_001c9635:
    uStack_38._0_4_ = 0x1c9642;
    uStack_38._4_4_ = 0;
    run_test_tcp_close_reset_accepted_cold_2();
LAB_001c9642:
    uStack_38._0_4_ = 0x1c964f;
    uStack_38._4_4_ = 0;
    run_test_tcp_close_reset_accepted_cold_3();
LAB_001c964f:
    uStack_38._0_4_ = 0x1c965c;
    uStack_38._4_4_ = 0;
    run_test_tcp_close_reset_accepted_cold_4();
LAB_001c965c:
    uStack_38._0_4_ = 0x1c9669;
    uStack_38._4_4_ = 0;
    run_test_tcp_close_reset_accepted_cold_5();
LAB_001c9669:
    uStack_38._0_4_ = 0x1c9676;
    uStack_38._4_4_ = 0;
    run_test_tcp_close_reset_accepted_cold_6();
LAB_001c9676:
    uStack_38._0_4_ = 0x1c9683;
    uStack_38._4_4_ = 0;
    run_test_tcp_close_reset_accepted_cold_7();
  }
  uStack_38 = run_test_tcp_close_reset_accepted_after_shutdown;
  run_test_tcp_close_reset_accepted_cold_8();
  puVar4 = (uv_tcp_t *)auStack_48;
  puStack_50 = (uv_loop_t *)0x1c969a;
  uStack_38 = (code *)unaff_RBX;
  loop = (uv_loop_t *)uv_default_loop();
  puStack_50 = (uv_loop_t *)0x1c96a9;
  start_server(loop,handle);
  client_close = 0;
  shutdown_before_close = 1;
  puStack_50 = (uv_loop_t *)0x1c96c6;
  do_connect(loop,handle);
  auStack_48._8_8_ = SEXT48(write_cb_called);
  auStack_48._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_48._8_8_ == (uv_loop_t *)0x0) {
    auStack_48._8_8_ = SEXT48(close_cb_called);
    auStack_48._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_48._8_8_ != (uv_loop_t *)0x0) goto LAB_001c9826;
    auStack_48._8_8_ = SEXT48(shutdown_cb_called);
    auStack_48._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_48._8_8_ != (uv_loop_t *)0x0) goto LAB_001c9833;
    puStack_50 = (uv_loop_t *)0x1c973d;
    iVar2 = uv_run(loop,0);
    puVar1 = loop;
    auStack_48._8_8_ = SEXT48(iVar2);
    auStack_48._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_48._8_8_ != (uv_loop_t *)0x0) goto LAB_001c9840;
    auStack_48._8_8_ = (uv_loop_t *)0x4;
    auStack_48._0_8_ = SEXT48(write_cb_called);
    if ((uv_loop_t *)auStack_48._0_8_ != (uv_loop_t *)0x4) goto LAB_001c984d;
    auStack_48._8_8_ = SEXT48(close_cb_called);
    auStack_48._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_48._8_8_ != (uv_loop_t *)0x0) goto LAB_001c985a;
    auStack_48._8_8_ = (uv_loop_t *)0x1;
    auStack_48._0_8_ = SEXT48(shutdown_cb_called);
    if ((uv_loop_t *)auStack_48._0_8_ != (uv_loop_t *)0x1) goto LAB_001c9867;
    puStack_50 = (uv_loop_t *)0x1c97dc;
    uv_walk(loop,close_walk_cb,0);
    puStack_50 = (uv_loop_t *)0x1c97e6;
    uv_run(puVar1,0);
    auStack_48._8_8_ = (uv_loop_t *)0x0;
    puStack_50 = (uv_loop_t *)0x1c97fb;
    iVar2 = uv_loop_close(loop);
    auStack_48._0_8_ = SEXT48(iVar2);
    unaff_RBX = puVar1;
    if (auStack_48._8_8_ == auStack_48._0_8_) {
      puStack_50 = (uv_loop_t *)0x1c9811;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_50 = (uv_loop_t *)0x1c9826;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_1();
LAB_001c9826:
    puStack_50 = (uv_loop_t *)0x1c9833;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_2();
LAB_001c9833:
    puStack_50 = (uv_loop_t *)0x1c9840;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_3();
LAB_001c9840:
    puStack_50 = (uv_loop_t *)0x1c984d;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_4();
LAB_001c984d:
    puStack_50 = (uv_loop_t *)0x1c985a;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_5();
LAB_001c985a:
    puStack_50 = (uv_loop_t *)0x1c9867;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_6();
LAB_001c9867:
    puStack_50 = (uv_loop_t *)0x1c9874;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_7();
  }
  puStack_50 = (uv_loop_t *)run_test_tcp_close_reset_accepted_after_socket_shutdown;
  run_test_tcp_close_reset_accepted_after_shutdown_cold_8();
  iVar2 = (int)&lStack_60;
  puStack_50 = unaff_RBX;
  loop = (uv_loop_t *)uv_default_loop();
  start_server(loop,puVar4);
  client_close = 0;
  shutdown_before_close = 2;
  do_connect(loop,puVar4);
  lStack_58 = (long)write_cb_called;
  lStack_60 = 0;
  if (lStack_58 == 0) {
    lStack_58 = (long)close_cb_called;
    lStack_60 = 0;
    if (lStack_58 != 0) goto LAB_001c9a17;
    lStack_58 = (long)shutdown_cb_called;
    lStack_60 = 0;
    if (lStack_58 != 0) goto LAB_001c9a24;
    iVar3 = uv_run(loop,0);
    puVar1 = loop;
    lStack_58 = (long)iVar3;
    lStack_60 = 0;
    if (lStack_58 != 0) goto LAB_001c9a31;
    lStack_58 = 4;
    lStack_60 = (long)write_cb_called;
    if (lStack_60 != 4) goto LAB_001c9a3e;
    lStack_58 = 1;
    lStack_60 = (long)close_cb_called;
    if (lStack_60 != 1) goto LAB_001c9a4b;
    lStack_58 = (long)shutdown_cb_called;
    lStack_60 = 0;
    if (lStack_58 != 0) goto LAB_001c9a58;
    uv_walk(loop,close_walk_cb,0);
    uv_run(puVar1,0);
    lStack_58 = 0;
    iVar3 = uv_loop_close(loop);
    lStack_60 = (long)iVar3;
    if (lStack_58 == lStack_60) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_1();
LAB_001c9a17:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_2();
LAB_001c9a24:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_3();
LAB_001c9a31:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_4();
LAB_001c9a3e:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_5();
LAB_001c9a4b:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_6();
LAB_001c9a58:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_7();
  }
  plVar5 = &lStack_58;
  run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_8();
  if (iVar2 == 0) {
    iVar2 = uv_tcp_init(loop,&tcp_accepted);
    if (iVar2 == 0) {
      iVar2 = uv_accept(plVar5,&tcp_accepted);
      if (iVar2 == 0) {
        iVar2 = uv_read_start(&tcp_accepted,alloc_cb,read_cb);
        return iVar2;
      }
      goto LAB_001c9b24;
    }
  }
  else {
    connection_cb_cold_1();
  }
  connection_cb_cold_2();
LAB_001c9b24:
  connection_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x400;
  return 0x37e460;
}

Assistant:

TEST_IMPL(tcp_close_reset_client_after_shutdown) {
  int r;

  loop = uv_default_loop();

  start_server(loop, &tcp_server);

  client_close = 1;
  shutdown_before_close = 1;

  do_connect(loop, &tcp_client);

  ASSERT_OK(write_cb_called);
  ASSERT_OK(close_cb_called);
  ASSERT_OK(shutdown_cb_called);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(4, write_cb_called);
  ASSERT_OK(close_cb_called);
  ASSERT_EQ(1, shutdown_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}